

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O1

int32_t icu_63::anon_unknown_10::toLower
                  (int32_t caseLocale,uint32_t options,UChar *dest,int32_t destCapacity,UChar *src,
                  UCaseContext *csc,int32_t srcStart,int32_t srcLimit,Edits *edits,
                  UErrorCode *errorCode)

{
  UChar UVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  UChar *pUVar8;
  uint uVar9;
  int unchangedLength;
  ulong uVar10;
  bool bVar11;
  char cVar12;
  uint local_80;
  undefined1 *local_50;
  UChar *s;
  UCaseContext *local_40;
  UTrie2 *local_38;
  
  local_50 = LatinCase::TO_LOWER_NORMAL;
  if (caseLocale != 1) {
    if (caseLocale < 0) {
      if ((options & 7) == 0) goto LAB_002fd512;
    }
    else if ((caseLocale & 0x7ffffffeU) != 2) goto LAB_002fd512;
    local_50 = LatinCase::TO_LOWER_TR_LT;
  }
LAB_002fd512:
  uVar5 = 0;
  pUVar8 = src;
  local_40 = csc;
  local_38 = ucase_getTrie_63();
  local_80 = srcStart;
  do {
    if (srcStart < srcLimit) {
      do {
        UVar1 = src[srcStart];
        uVar10 = (ulong)(ushort)UVar1;
        uVar9 = local_80;
        if ((ushort)UVar1 < 0x17f) {
          cVar12 = local_50[uVar10];
          if ((int)cVar12 == 0xffffff80) {
            bVar3 = false;
            cVar12 = '\x05';
          }
          else {
            srcStart = srcStart + 1;
            bVar11 = cVar12 == '\0';
            bVar3 = !bVar11;
            pUVar8 = (UChar *)((ulong)pUVar8 & 0xffffffff);
            if (!bVar11) {
              pUVar8 = (UChar *)(ulong)(uint)(int)cVar12;
            }
            cVar12 = bVar11 << 2;
          }
LAB_002fd5ea:
          if (bVar3) {
            iVar6 = ~local_80 + srcStart;
            uVar9 = uVar5;
            if (0 < iVar6) {
              if (edits != (Edits *)0x0) {
                Edits::addUnchanged(edits,iVar6);
              }
              if ((((options >> 0xe & 1) == 0) &&
                  (uVar9 = 0xffffffff, iVar6 <= (int)(uVar5 ^ 0x7fffffff))) &&
                 (uVar9 = iVar6 + uVar5, (int)uVar9 <= destCapacity)) {
                u_memcpy_63(dest + (int)uVar5,src + (int)local_80,iVar6);
              }
            }
            uVar5 = uVar9;
            uVar9 = (uint)(ushort)UVar1 + (int)pUVar8;
            uVar10 = (ulong)uVar9;
            if (-1 < (int)uVar5) {
              if ((int)uVar5 < destCapacity) {
                dest[uVar5] = (UChar)uVar9;
LAB_002fd6ad:
                uVar9 = uVar5 + 1;
              }
              else {
                uVar9 = 0xffffffff;
                if (uVar5 != 0x7fffffff) goto LAB_002fd6ad;
              }
              uVar5 = uVar9;
              if (edits != (Edits *)0x0) {
                Edits::addReplace(edits,1,1);
              }
            }
            cVar12 = '\0';
            uVar9 = srcStart;
            if ((int)uVar5 < 0) {
              *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
              cVar12 = '\x01';
              uVar9 = local_80;
            }
          }
        }
        else {
          cVar12 = '\x05';
          if ((ushort)UVar1 < 0xd800) {
            uVar2 = local_38->index
                    [((ushort)UVar1 & 0x1f) + (uint)local_38->index[(ushort)UVar1 >> 5] * 4];
            if ((uVar2 & 8) == 0) {
              srcStart = srcStart + 1;
              cVar12 = '\x04';
              bVar3 = false;
              if ((uVar2 & 2) != 0) {
                if (uVar2 < 0x80) {
                  pUVar8 = (UChar *)0x0;
                }
                else {
                  pUVar8 = (UChar *)(ulong)((uint)(int)(short)uVar2 >> 7 & 0xffff);
                  cVar12 = '\0';
                  bVar3 = true;
                }
              }
            }
            else {
              bVar3 = false;
            }
            goto LAB_002fd5ea;
          }
        }
        local_80 = uVar9;
        if ((cVar12 != '\0') && (cVar12 != '\x04')) {
          uVar4 = local_80;
          if (cVar12 != '\x05') goto LAB_002fd8f4;
          break;
        }
      } while (srcStart < srcLimit);
      uVar7 = (uint)uVar10 & 0xffff;
      uVar9 = srcStart;
    }
    else {
      uVar7 = 0;
      uVar9 = srcStart;
    }
    cVar12 = '\x02';
    srcStart = uVar9;
    uVar4 = local_80;
    if ((int)uVar9 < srcLimit) {
      srcStart = uVar9 + 1;
      if ((((uVar7 & 0xfc00) == 0xd800) && (srcStart < srcLimit)) &&
         (((ushort)src[srcStart] & 0xfc00) == 0xdc00)) {
        uVar7 = uVar7 * 0x400 + (uint)(ushort)src[srcStart] + 0xfca02400;
        srcStart = uVar9 + 2;
      }
      if (caseLocale < 0) {
        iVar6 = ucase_toFullFolding_63(uVar7,&s,options);
      }
      else {
        local_40->cpStart = uVar9;
        local_40->cpLimit = srcStart;
        iVar6 = ucase_toFullLower_63(uVar7,utf16_caseContextIterator,local_40,&s,caseLocale);
      }
      cVar12 = '\0';
      if (-1 < iVar6) {
        unchangedLength = uVar9 - local_80;
        uVar7 = uVar5;
        if (unchangedLength != 0 && (int)local_80 <= (int)uVar9) {
          if (edits != (Edits *)0x0) {
            Edits::addUnchanged(edits,unchangedLength);
          }
          if ((((options >> 0xe & 1) == 0) &&
              (uVar7 = 0xffffffff, unchangedLength <= (int)(uVar5 ^ 0x7fffffff))) &&
             (uVar7 = unchangedLength + uVar5, (int)uVar7 <= destCapacity)) {
            u_memcpy_63(dest + (int)uVar5,src + (int)local_80,unchangedLength);
          }
        }
        uVar5 = uVar7;
        if (-1 < (int)uVar7) {
          uVar5 = appendResult(dest,uVar7,destCapacity,iVar6,s,srcStart - uVar9,options,edits);
        }
        cVar12 = (int)uVar5 < 0;
        uVar4 = srcStart;
        if ((bool)cVar12) {
          *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
          uVar4 = local_80;
        }
      }
    }
LAB_002fd8f4:
    local_80 = uVar4;
    if (cVar12 != '\0') {
      if (cVar12 == '\x02') {
        iVar6 = srcStart - local_80;
        uVar9 = uVar5;
        if (iVar6 != 0 && (int)local_80 <= srcStart) {
          if (edits != (Edits *)0x0) {
            Edits::addUnchanged(edits,iVar6);
          }
          if ((((options >> 0xe & 1) == 0) &&
              (uVar9 = 0xffffffff, iVar6 <= (int)(uVar5 ^ 0x7fffffff))) &&
             (uVar9 = iVar6 + uVar5, (int)uVar9 <= destCapacity)) {
            u_memcpy_63(dest + (int)uVar5,src + (int)local_80,iVar6);
          }
        }
        if (-1 < (int)uVar9) {
          return uVar9;
        }
        *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      return 0;
    }
  } while( true );
}

Assistant:

int32_t toLower(int32_t caseLocale, uint32_t options,
                UChar *dest, int32_t destCapacity,
                const UChar *src, UCaseContext *csc, int32_t srcStart, int32_t srcLimit,
                icu::Edits *edits, UErrorCode &errorCode) {
    const int8_t *latinToLower;
    if (caseLocale == UCASE_LOC_ROOT ||
            (caseLocale >= 0 ?
                !(caseLocale == UCASE_LOC_TURKISH || caseLocale == UCASE_LOC_LITHUANIAN) :
                (options & _FOLD_CASE_OPTIONS_MASK) == U_FOLD_CASE_DEFAULT)) {
        latinToLower = LatinCase::TO_LOWER_NORMAL;
    } else {
        latinToLower = LatinCase::TO_LOWER_TR_LT;
    }
    const UTrie2 *trie = ucase_getTrie();
    int32_t destIndex = 0;
    int32_t prev = srcStart;
    int32_t srcIndex = srcStart;
    for (;;) {
        // fast path for simple cases
        UChar lead = 0;
        while (srcIndex < srcLimit) {
            lead = src[srcIndex];
            int32_t delta;
            if (lead < LatinCase::LONG_S) {
                int8_t d = latinToLower[lead];
                if (d == LatinCase::EXC) { break; }
                ++srcIndex;
                if (d == 0) { continue; }
                delta = d;
            } else if (lead >= 0xd800) {
                break;  // surrogate or higher
            } else {
                uint16_t props = UTRIE2_GET16_FROM_U16_SINGLE_LEAD(trie, lead);
                if (UCASE_HAS_EXCEPTION(props)) { break; }
                ++srcIndex;
                if (!UCASE_IS_UPPER_OR_TITLE(props) || (delta = UCASE_GET_DELTA(props)) == 0) {
                    continue;
                }
            }
            lead += static_cast<UChar>(delta);
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, srcIndex - 1 - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendUChar(dest, destIndex, destCapacity, lead);
                if (edits != nullptr) {
                    edits->addReplace(1, 1);
                }
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
        if (srcIndex >= srcLimit) {
            break;
        }
        // slow path
        int32_t cpStart = srcIndex++;
        UChar trail;
        UChar32 c;
        if (U16_IS_LEAD(lead) && srcIndex < srcLimit && U16_IS_TRAIL(trail = src[srcIndex])) {
            c = U16_GET_SUPPLEMENTARY(lead, trail);
            ++srcIndex;
        } else {
            c = lead;
        }
        const UChar *s;
        if (caseLocale >= 0) {
            csc->cpStart = cpStart;
            csc->cpLimit = srcIndex;
            c = ucase_toFullLower(c, utf16_caseContextIterator, csc, &s, caseLocale);
        } else {
            c = ucase_toFullFolding(c, &s, options);
        }
        if (c >= 0) {
            destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                        src + prev, cpStart - prev, options, edits);
            if (destIndex >= 0) {
                destIndex = appendResult(dest, destIndex, destCapacity, c, s,
                                         srcIndex - cpStart, options, edits);
            }
            if (destIndex < 0) {
                errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }
            prev = srcIndex;
        }
    }
    destIndex = appendUnchanged(dest, destIndex, destCapacity,
                                src + prev, srcIndex - prev, options, edits);
    if (destIndex < 0) {
        errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    return destIndex;
}